

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

void __thiscall
RTree<int,_double,_2,_double,_8,_4>::InitParVars
          (RTree<int,_double,_2,_double,_8,_4> *this,PartitionVars *a_parVars,int a_maxRects,
          int a_minFill)

{
  ulong uVar1;
  ulong uVar2;
  
  if (a_parVars != (PartitionVars *)0x0) {
    a_parVars->m_count[0] = 0;
    a_parVars->m_count[1] = 0;
    a_parVars->m_area[0] = 0.0;
    a_parVars->m_area[1] = 0.0;
    a_parVars->m_total = a_maxRects;
    a_parVars->m_minFill = a_minFill;
    uVar1 = 0;
    uVar2 = (ulong)(uint)a_maxRects;
    if (a_maxRects < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      a_parVars->m_partition[uVar1] = -1;
    }
    return;
  }
  __assert_fail("a_parVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                ,0x573,
                "void RTree<int, double, 2>::InitParVars(PartitionVars *, int, int) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
               );
}

Assistant:

RTREE_TEMPLATE
void RTREE_QUAL::InitParVars(PartitionVars* a_parVars, int a_maxRects, int a_minFill)
{
  ASSERT(a_parVars);

  a_parVars->m_count[0] = a_parVars->m_count[1] = 0;
  a_parVars->m_area[0] = a_parVars->m_area[1] = (ELEMTYPEREAL)0;
  a_parVars->m_total = a_maxRects;
  a_parVars->m_minFill = a_minFill;
  for(int index=0; index < a_maxRects; ++index)
  {
    a_parVars->m_partition[index] = PartitionVars::NOT_TAKEN;
  }
}